

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymul.hpp
# Opt level: O3

void polymul_internal::taylor_inplace_multiplier<double,_2,_7,_9,_7>::mul(double *p1,double *p2)

{
  int iVar1;
  int iVar2;
  long lVar3;
  
  iVar1 = binomial(8,6);
  iVar2 = binomial(9,7);
  if (iVar1 < iVar2) {
    lVar3 = (long)iVar1;
    do {
      p1[lVar3] = p2[lVar3] * *p1 + p1[lVar3];
      lVar3 = lVar3 + 1;
      iVar1 = binomial(9,7);
    } while (lVar3 < iVar1);
  }
  taylor_inplace_multiplier<double,_2,_6,_9,_0>::mul(p1,p2);
  return;
}

Assistant:

static void mul(numtype POLYMUL_RESTRICT p1[], const numtype p2[]) {
    if (Ndeg <= Ndeg2) {
      for (int i = binomial(Nvar + Ndeg - 1, Ndeg - 1);
           i < binomial(Nvar + Ndeg, Ndeg);
           i++)
        p1[i] += p2[i] * p1[0];
    }
    taylor_inplace_multiplier<numtype, Nvar, Ndeg - 1, Ndeg2, 0>::mul(
        p1, p2); // Do lower degree terms, or go to (4)
  }